

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O2

void LoadAndCompileShader(GLuint shader,char *text)

{
  GLsizei len;
  GLint stat;
  GLint length;
  char *text_local;
  GLchar log [1000];
  
  length = -1;
  text_local = text;
  (*glad_glShaderSource)(shader,1,&text_local,&length);
  (*glad_glCompileShader)(shader);
  (*glad_glGetShaderiv)(shader,0x8b81,&stat);
  if (stat != 0) {
    return;
  }
  (*glad_glGetShaderInfoLog)(shader,1000,&len,log);
  fprintf(_stderr,"fslight: problem compiling shader:\n%s\n",log);
  exit(1);
}

Assistant:

static void
LoadAndCompileShader(GLuint shader, const char *text)
{
   const GLint length = -1;
   GLint stat;

   glShaderSource(shader, 1, (const GLchar **) &text, &length);

   glCompileShader(shader);

   glGetShaderiv(shader, GL_COMPILE_STATUS, &stat);
   if (!stat) {
      GLchar log[1000];
      GLsizei len;
      glGetShaderInfoLog(shader, 1000, &len, log);
      fprintf(stderr, "fslight: problem compiling shader:\n%s\n", log);
      exit(1);
   }
}